

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::Program::Program
          (Program *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_28;
  SharedPtr<tcu::ThreadUtil::Event> local_18;
  
  local_18.m_ptr = event->m_ptr;
  local_18.m_state = event->m_state;
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_28.m_ptr = sync->m_ptr;
  local_28.m_state = sync->m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::Object(&this->super_Object,"Program",&local_18,&local_28);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::release(&local_28);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_18);
  (this->super_Object).super_Object._vptr_Object = (_func_int **)&PTR__Program_01e00cb0;
  this->program = 0;
  this->runtimeVertexShader = 0;
  this->runtimeFragmentShader = 0;
  (this->vertexShader).m_ptr = (Shader *)0x0;
  (this->vertexShader).m_state = (SharedPtrStateBase *)0x0;
  (this->fragmentShader).m_ptr = (Shader *)0x0;
  (this->fragmentShader).m_state = (SharedPtrStateBase *)0x0;
  this->linked = false;
  return;
}

Assistant:

Program::Program (SharedPtr<tcu::ThreadUtil::Event> event, SharedPtr<FenceSync> sync)
	: Object					("Program", event, sync)
	, linked					(false)
	, program					(0)
	, runtimeVertexShader		(0)
	, runtimeFragmentShader		(0)
{
}